

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  char cVar1;
  char *ptr_00;
  DTD *pDVar2;
  XML_Bool XVar3;
  int iVar4;
  uint uVar5;
  XML_Error XVar6;
  char *pcVar7;
  XML_Char *pXVar8;
  NAMED *pNVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  ulong uVar11;
  char *next;
  XML_Char buf [4];
  char *local_60;
  uint local_58;
  char local_54 [4];
  char *local_50;
  STRING_POOL *local_48;
  DTD *local_40;
  STRING_POOL *local_38;
  
  uVar10 = CONCAT71(in_register_00000011,isCdata) & 0xffffffff;
  local_40 = parser->m_dtd;
  local_38 = &parser->m_temp2Pool;
  local_48 = &local_40->pool;
LAB_004d601a:
  pcVar7 = ptr;
  iVar4 = (*enc->literalScanners[0])(enc,pcVar7,end,&local_60);
  switch(iVar4) {
  case 0:
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = local_60;
      return XML_ERROR_INVALID_TOKEN;
    }
    return XML_ERROR_INVALID_TOKEN;
  case 6:
    pXVar8 = poolAppend(pool,enc,pcVar7,local_60);
    ptr = local_60;
    if (pXVar8 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    goto LAB_004d601a;
  case 7:
    break;
  case 9:
    iVar4 = (*enc->predefinedEntityName)
                      (enc,pcVar7 + enc->minBytesPerChar,local_60 + -(long)enc->minBytesPerChar);
    if ((char)iVar4 == '\0') {
      pXVar8 = poolStoreString(local_38,enc,pcVar7 + enc->minBytesPerChar,
                               local_60 + -(long)enc->minBytesPerChar);
      pDVar2 = local_40;
      if (pXVar8 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      local_58 = (uint)uVar10;
      local_50 = end;
      pNVar9 = lookup(parser,&local_40->generalEntities,pXVar8,0);
      end = local_50;
      (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
      if (local_48 == pool) {
        if (pDVar2->standalone == '\0') {
          if (pDVar2->hasParamEntityRefs != '\0') goto LAB_004d6266;
          goto LAB_004d6231;
        }
        if (parser->m_openInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) goto LAB_004d6231;
LAB_004d6266:
        uVar10 = (ulong)local_58;
        ptr = local_60;
        if (pNVar9 == (NAMED *)0x0) goto LAB_004d601a;
      }
      else {
        if ((pDVar2->hasParamEntityRefs != '\0') && (pDVar2->standalone == '\0')) goto LAB_004d6266;
LAB_004d6231:
        if (pNVar9 == (NAMED *)0x0) {
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (*(char *)((long)&pNVar9[7].name + 2) == '\0') {
          return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
      }
      uVar10 = (ulong)local_58;
      if (*(char *)&pNVar9[7].name != '\0') {
        XVar6 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_004d6345;
      }
      if (pNVar9[6].name != (KEY)0x0) {
        XVar6 = XML_ERROR_BINARY_ENTITY_REF;
        goto LAB_004d6345;
      }
      ptr_00 = pNVar9[1].name;
      if (ptr_00 == (char *)0x0) {
        XVar6 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        goto LAB_004d6345;
      }
      *(undefined1 *)&pNVar9[7].name = 1;
      XVar6 = appendAttributeValue
                        (parser,parser->m_internalEncoding,(XML_Bool)local_58,ptr_00,
                         ptr_00 + *(int *)&pNVar9[2].name,pool);
      *(undefined1 *)&pNVar9[7].name = 0;
      ptr = local_60;
      if (XVar6 != XML_ERROR_NONE) {
        return XVar6;
      }
    }
    else {
      pcVar7 = pool->ptr;
      if (pcVar7 == pool->end) {
        XVar3 = poolGrow(pool);
        if (XVar3 == '\0') {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar7 = pool->ptr;
      }
      pool->ptr = pcVar7 + 1;
      *pcVar7 = (char)iVar4;
      ptr = local_60;
    }
    goto LAB_004d601a;
  case 10:
    iVar4 = (*enc->charRefNumber)(enc,pcVar7);
    if (-1 < iVar4) {
      if ((iVar4 == 0x20 && (char)uVar10 == '\0') &&
         ((ptr = local_60, pool->ptr == pool->start || (ptr = local_60, pool->ptr[-1] == ' '))))
      goto LAB_004d601a;
      uVar5 = XmlUtf8Encode(iVar4,local_54);
      if (uVar5 != 0) {
        ptr = local_60;
        if (0 < (int)uVar5) {
          uVar11 = 0;
          do {
            pcVar7 = pool->ptr;
            if (pcVar7 == pool->end) {
              XVar3 = poolGrow(pool);
              if (XVar3 == '\0') {
                return XML_ERROR_NO_MEMORY;
              }
              pcVar7 = pool->ptr;
            }
            cVar1 = local_54[uVar11];
            pool->ptr = pcVar7 + 1;
            *pcVar7 = cVar1;
            uVar11 = uVar11 + 1;
            ptr = local_60;
          } while (uVar5 != uVar11);
        }
        goto LAB_004d601a;
      }
    }
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = pcVar7;
      return XML_ERROR_BAD_CHAR_REF;
    }
    return XML_ERROR_BAD_CHAR_REF;
  case -4:
    return XML_ERROR_NONE;
  case -3:
    local_60 = pcVar7 + enc->minBytesPerChar;
    break;
  case -2:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 8:
switchD_004d6042_caseD_fffffffe:
    XVar6 = XML_ERROR_UNEXPECTED_STATE;
LAB_004d6345:
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = pcVar7;
      return XVar6;
    }
    return XVar6;
  case -1:
    XVar6 = XML_ERROR_INVALID_TOKEN;
    goto LAB_004d6345;
  default:
    if (iVar4 != 0x27) goto switchD_004d6042_caseD_fffffffe;
  }
  pXVar8 = pool->ptr;
  if (((char)uVar10 != '\0') ||
     ((ptr = local_60, pXVar8 != pool->start && (ptr = local_60, pXVar8[-1] != ' ')))) {
    if (pXVar8 == pool->end) {
      XVar3 = poolGrow(pool);
      if (XVar3 == '\0') {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar8 = pool->ptr;
    }
    pool->ptr = pXVar8 + 1;
    *pXVar8 = ' ';
    ptr = local_60;
  }
  goto LAB_004d601a;
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        char checkEntityDecl;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
                return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&temp2Pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal.
        */
        if (pool == &dtd->pool)  /* are we called from prolog? */
          checkEntityDecl =
#ifdef XML_DTD
              prologState.documentEntity &&
#endif /* XML_DTD */
              (dtd->standalone
               ? !openInternalEntities
               : !dtd->hasParamEntityRefs);
        else /* if (pool == &tempPool): we are called from content */
          checkEntityDecl = !dtd->hasParamEntityRefs || dtd->standalone;
        if (checkEntityDecl) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          /* Cannot report skipped entity here - see comments on
             skippedEntityHandler.
          if (skippedEntityHandler)
            skippedEntityHandler(handlerArg, name, 0);
          */
          /* Cannot call the default handler because this would be
             out of sync with the call to the startElementHandler.
          if ((pool == &tempPool) && defaultHandler)
            reportDefault(parser, enc, ptr, next);
          */
          break;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (!entity->textPtr) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = XML_TRUE;
          result = appendAttributeValue(parser, internalEncoding, isCdata,
                                        (char *)entity->textPtr,
                                        (char *)textEnd, pool);
          entity->open = XML_FALSE;
          if (result)
            return result;
        }
      }
      break;
    default:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    ptr = next;
  }
  /* not reached */
}